

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::toggle_decision_heuristic(Solver *this,bool to_VSIDS)

{
  bool bVar1;
  byte in_SIL;
  Solver *in_RDI;
  Heap<Minisat::Solver::VarOrderLt> *unaff_retaddr;
  Heap<Minisat::Solver::VarOrderLt> *currentHeap;
  Heap<Minisat::Solver::VarOrderLt> *in_stack_ffffffffffffffc8;
  Heap<Minisat::Solver::VarOrderLt> *in_stack_ffffffffffffffd0;
  Heap<Minisat::Solver::VarOrderLt> *local_28;
  Solver *pSVar2;
  
  if ((in_SIL & 1) == 0) {
    if (in_RDI->current_heuristic == VSIDS_CHB) {
      pSVar2 = in_RDI;
      Heap<Minisat::Solver::VarOrderLt>::growTo<Minisat::Solver::VarOrderLt>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      Heap<Minisat::Solver::VarOrderLt>::elements(&in_RDI->order_heap_VSIDS);
      Heap<Minisat::Solver::VarOrderLt>::build(unaff_retaddr,(vec<int> *)pSVar2);
      in_RDI->order_heap = &in_RDI->order_heap_CHB;
      in_RDI->current_heuristic = CHB;
    }
    else {
      pSVar2 = in_RDI;
      Heap<Minisat::Solver::VarOrderLt>::growTo<Minisat::Solver::VarOrderLt>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      Heap<Minisat::Solver::VarOrderLt>::elements(&in_RDI->order_heap_VSIDS);
      Heap<Minisat::Solver::VarOrderLt>::build(unaff_retaddr,(vec<int> *)pSVar2);
      in_RDI->order_heap = &in_RDI->order_heap_DISTANCE;
      in_RDI->current_heuristic = DISTANCE;
    }
  }
  else {
    pSVar2 = in_RDI;
    bVar1 = usesDISTANCE(in_RDI);
    if (bVar1) {
      local_28 = &in_RDI->order_heap_DISTANCE;
    }
    else {
      local_28 = &in_RDI->order_heap_CHB;
    }
    Heap<Minisat::Solver::VarOrderLt>::growTo<Minisat::Solver::VarOrderLt>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    Heap<Minisat::Solver::VarOrderLt>::elements(local_28);
    Heap<Minisat::Solver::VarOrderLt>::build(unaff_retaddr,(vec<int> *)pSVar2);
    in_RDI->order_heap = &in_RDI->order_heap_VSIDS;
    in_RDI->current_heuristic = (uint)(in_RDI->current_heuristic != CHB);
  }
  return;
}

Assistant:

void Solver::toggle_decision_heuristic(bool to_VSIDS)
{
    if (to_VSIDS) { // initialize VSIDS heap again?
        assert(!usesVSIDS() && "should not from VSIDS to itself");
        Heap<VarOrderLt> &currentHeap = usesDISTANCE() ? order_heap_DISTANCE : order_heap_CHB;
        order_heap_VSIDS.growTo(currentHeap);
        order_heap_VSIDS.build(currentHeap.elements());
        order_heap = &order_heap_VSIDS;
        current_heuristic = current_heuristic == CHB ? VSIDS_CHB : VSIDS_DISTANCE;
    } else {
        assert(usesVSIDS() && "should come from VSIDS");
        if (current_heuristic == VSIDS_CHB) {
            order_heap_CHB.growTo(order_heap_VSIDS);
            order_heap_CHB.build(order_heap_VSIDS.elements());
            order_heap = &order_heap_CHB;
            current_heuristic = CHB;
        } else {
            order_heap_DISTANCE.growTo(order_heap_VSIDS);
            order_heap_DISTANCE.build(order_heap_VSIDS.elements());
            order_heap = &order_heap_DISTANCE;
            current_heuristic = DISTANCE;
        }
    }
    assert((trail.size() + order_heap->size()) >= full_heap_size);
}